

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall perfetto::ProducerIPCClientImpl::~ProducerIPCClientImpl(ProducerIPCClientImpl *this)

{
  (this->super_ProducerEndpoint)._vptr_ProducerEndpoint =
       (_func_int **)&PTR__ProducerIPCClientImpl_00409d58;
  (this->super_EventListener)._vptr_EventListener =
       (_func_int **)&PTR__ProducerIPCClientImpl_00409e08;
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
            (&this->pending_sync_reqs_);
  ::std::__cxx11::string::~string((string *)&this->name_);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&(this->data_sources_setup_)._M_t);
  std::
  unique_ptr<perfetto::SharedMemoryArbiter,_std::default_delete<perfetto::SharedMemoryArbiter>_>::
  ~unique_ptr(&this->shared_memory_arbiter_);
  std::unique_ptr<perfetto::SharedMemory,_std::default_delete<perfetto::SharedMemory>_>::~unique_ptr
            (&this->shared_memory_);
  protos::gen::ProducerPortProxy::~ProducerPortProxy(&this->producer_port_);
  std::unique_ptr<perfetto::ipc::Client,_std::default_delete<perfetto::ipc::Client>_>::~unique_ptr
            (&this->ipc_channel_);
  return;
}

Assistant:

ProducerIPCClientImpl::~ProducerIPCClientImpl() {
  PERFETTO_DCHECK_THREAD(thread_checker_);
}